

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::GELU_x86_avx512::forward_inplace(GELU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float afVar9 [16];
  float afVar10 [16];
  float afVar11 [16];
  float afVar12 [16];
  float afVar13 [16];
  float afVar14 [16];
  float afVar15 [16];
  float afVar16 [16];
  float afVar17 [16];
  float afVar18 [16];
  float afVar19 [16];
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  undefined1 (*pauVar26) [64];
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 extraout_var [60];
  float fVar59;
  float fVar62;
  float fVar63;
  float fVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  float afVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_GELU_x86_avx512[-3]) == 0) {
    iVar22 = GELU::forward_inplace
                       ((GELU *)((long)&this->_vptr_GELU_x86_avx512 +
                                (long)this->_vptr_GELU_x86_avx512[-3]),bottom_top_blob,opt);
    return iVar22;
  }
  iVar22 = bottom_top_blob->c;
  if (0 < (long)iVar22) {
    uVar24 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->elempack;
    lVar25 = 0;
    auVar51 = vbroadcastss_avx512f(ZEXT416(0x3d372713));
    auVar52 = vbroadcastss_avx512f(ZEXT416(0x3f4c4229));
    auVar53 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
    auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3d372713));
    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f4c4229));
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0xc1100000));
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x41100000));
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0xa59f25c0));
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x2a61337e));
    auVar40 = vbroadcastss_avx512vl(ZEXT416(0xaebd37ff));
    auVar41 = vbroadcastss_avx512vl(ZEXT416(0x335c0041));
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3779434a));
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3a270ded));
    auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3ba059dc));
    auVar45 = vbroadcastss_avx512vl(ZEXT416(0x35a0d3d8));
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x38f895d6));
    do {
      afVar19 = _ps512_cephes_tanh_p9;
      afVar18 = _ps512_cephes_tanh_p8;
      afVar17 = _ps512_cephes_tanh_p7;
      afVar16 = _ps512_cephes_tanh_p6;
      afVar15 = _ps512_cephes_tanh_p5;
      afVar14 = _ps512_cephes_tanh_p4;
      afVar13 = _ps512_cephes_tanh_p3;
      afVar12 = _ps512_cephes_tanh_p2;
      afVar11 = _ps512_cephes_tanh_p1;
      afVar10 = _ps512_cephes_tanh_p0;
      afVar9 = _ps512_tanh_hi;
      afVar70 = _ps512_tanh_lo;
      pauVar26 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * lVar25 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar24 < 0x10) {
        uVar21 = 0;
      }
      else {
        iVar20 = 0xf;
        do {
          auVar58 = *pauVar26;
          auVar54 = vmulps_avx512f(auVar58,auVar58);
          auVar54 = vmulps_avx512f(auVar54,auVar51);
          auVar54 = vfmadd213ps_avx512f(auVar54,auVar58,auVar58);
          auVar54 = vmulps_avx512f(auVar54,auVar52);
          auVar54 = vmaxps_avx512f((undefined1  [64])afVar70,auVar54);
          auVar54 = vminps_avx512f((undefined1  [64])afVar9,auVar54);
          auVar55 = vmulps_avx512f(auVar54,auVar54);
          auVar56 = vfmadd213ps_avx512f((undefined1  [64])afVar10,auVar55,(undefined1  [64])afVar11)
          ;
          auVar56 = vfmadd213ps_avx512f(auVar56,auVar55,(undefined1  [64])afVar12);
          auVar56 = vfmadd213ps_avx512f(auVar56,auVar55,(undefined1  [64])afVar13);
          auVar56 = vfmadd213ps_avx512f(auVar56,auVar55,(undefined1  [64])afVar14);
          auVar56 = vfmadd213ps_avx512f(auVar56,auVar55,(undefined1  [64])afVar15);
          auVar56 = vfmadd213ps_avx512f(auVar56,auVar55,(undefined1  [64])afVar16);
          auVar54 = vmulps_avx512f(auVar56,auVar54);
          auVar56 = vfmadd213ps_avx512f((undefined1  [64])afVar17,auVar55,(undefined1  [64])afVar18)
          ;
          auVar56 = vfmadd213ps_avx512f(auVar56,auVar55,(undefined1  [64])afVar19);
          auVar55 = vfmadd213ps_avx512f(auVar56,auVar55,(undefined1  [64])afVar16);
          auVar56 = vrcp14ps_avx512f(auVar55);
          auVar57 = vmulps_avx512f(auVar54,auVar56);
          auVar54 = vfmsub213ps_avx512f(auVar55,auVar57,auVar54);
          auVar54 = vfnmadd213ps_avx512f(auVar54,auVar56,auVar57);
          auVar58 = vmulps_avx512f(auVar58,auVar53);
          auVar58 = vfmadd213ps_avx512f(auVar58,auVar54,auVar58);
          *pauVar26 = auVar58;
          pauVar26 = pauVar26 + 1;
          iVar20 = iVar20 + 0x10;
        } while (iVar20 < (int)uVar24);
        auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3d372713));
        uVar21 = uVar24 & 0xfffffff0;
      }
      uVar23 = uVar21 | 7;
      auVar72._8_4_ = 0x3b14aa05;
      auVar72._0_8_ = 0x3b14aa053b14aa05;
      auVar72._12_4_ = 0x3b14aa05;
      auVar72._16_4_ = 0x3b14aa05;
      auVar72._20_4_ = 0x3b14aa05;
      auVar72._24_4_ = 0x3b14aa05;
      auVar72._28_4_ = 0x3b14aa05;
      auVar73._8_4_ = 0xc1100000;
      auVar73._0_8_ = 0xc1100000c1100000;
      auVar73._12_4_ = 0xc1100000;
      auVar74._8_4_ = 0x41100000;
      auVar74._0_8_ = 0x4110000041100000;
      auVar74._12_4_ = 0x41100000;
      auVar75._8_4_ = 0xa59f25c0;
      auVar75._0_8_ = 0xa59f25c0a59f25c0;
      auVar75._12_4_ = 0xa59f25c0;
      auVar76._8_4_ = 0x2a61337e;
      auVar76._0_8_ = 0x2a61337e2a61337e;
      auVar76._12_4_ = 0x2a61337e;
      auVar77._8_4_ = 0xaebd37ff;
      auVar77._0_8_ = 0xaebd37ffaebd37ff;
      auVar77._12_4_ = 0xaebd37ff;
      auVar78._8_4_ = 0x335c0041;
      auVar78._0_8_ = 0x335c0041335c0041;
      auVar78._12_4_ = 0x335c0041;
      auVar79._8_4_ = 0x3779434a;
      auVar79._0_8_ = 0x3779434a3779434a;
      auVar79._12_4_ = 0x3779434a;
      auVar80._8_4_ = 0x3a270ded;
      auVar80._0_8_ = 0x3a270ded3a270ded;
      auVar80._12_4_ = 0x3a270ded;
      auVar81._8_4_ = 0x3ba059dc;
      auVar81._0_8_ = 0x3ba059dc3ba059dc;
      auVar81._12_4_ = 0x3ba059dc;
      auVar28 = vbroadcastss_avx512vl(ZEXT416(0x35a0d3d8));
      auVar29 = vbroadcastss_avx512vl(ZEXT416(0x38f895d6));
      auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3b14aa05));
      while ((int)uVar23 < (int)uVar24) {
        auVar1 = *(undefined1 (*) [32])*pauVar26;
        fVar2 = auVar1._0_4_;
        auVar51._0_4_ = fVar2 * fVar2;
        fVar3 = auVar1._4_4_;
        auVar51._4_4_ = fVar3 * fVar3;
        fVar4 = auVar1._8_4_;
        auVar51._8_4_ = fVar4 * fVar4;
        fVar5 = auVar1._12_4_;
        auVar51._12_4_ = fVar5 * fVar5;
        fVar6 = auVar1._16_4_;
        auVar51._16_4_ = fVar6 * fVar6;
        fVar7 = auVar1._20_4_;
        auVar51._20_4_ = fVar7 * fVar7;
        fVar8 = auVar1._24_4_;
        auVar51._28_36_ = auVar53._28_36_;
        auVar51._24_4_ = fVar8 * fVar8;
        auVar47 = vmulps_avx512vl(auVar51._0_32_,auVar34);
        auVar31 = vfmadd213ps_fma(auVar47,auVar1,auVar1);
        auVar47 = vmulps_avx512vl(ZEXT1632(auVar31),auVar35);
        auVar47 = vmaxps_avx512vl(auVar47,auVar36);
        auVar48 = vminps_avx512vl(auVar47,auVar37);
        fVar59 = auVar48._0_4_;
        auVar53._0_4_ = fVar59 * fVar59;
        fVar62 = auVar48._4_4_;
        auVar53._4_4_ = fVar62 * fVar62;
        fVar63 = auVar48._8_4_;
        auVar53._8_4_ = fVar63 * fVar63;
        fVar64 = auVar48._12_4_;
        auVar53._12_4_ = fVar64 * fVar64;
        fVar65 = auVar48._16_4_;
        auVar53._16_4_ = fVar65 * fVar65;
        fVar66 = auVar48._20_4_;
        auVar53._20_4_ = fVar66 * fVar66;
        fVar67 = auVar48._24_4_;
        auVar53._28_36_ = afVar70._28_36_;
        auVar53._24_4_ = fVar67 * fVar67;
        auVar69 = auVar53._0_32_;
        auVar47 = vfmadd213ps_avx512vl(auVar38,auVar69,auVar39);
        auVar47 = vfmadd213ps_avx512vl(auVar47,auVar69,auVar40);
        auVar47 = vfmadd213ps_avx512vl(auVar47,auVar69,auVar41);
        auVar47 = vfmadd213ps_avx512vl(auVar47,auVar69,auVar42);
        auVar47 = vfmadd213ps_avx512vl(auVar47,auVar69,auVar43);
        auVar49 = vfmadd213ps_avx512vl(auVar47,auVar69,auVar44);
        auVar47 = vfmadd213ps_avx512vl(auVar45,auVar69,auVar46);
        auVar31 = vfmadd213ps_fma(auVar47,auVar69,auVar72);
        auVar50 = vfmadd213ps_avx512vl(ZEXT1632(auVar31),auVar69,auVar44);
        auVar47 = vrcpps_avx(auVar50);
        afVar70 = (float  [16])ZEXT3264(auVar47);
        fVar59 = auVar49._0_4_ * fVar59;
        fVar62 = auVar49._4_4_ * fVar62;
        auVar69._4_4_ = fVar62;
        auVar69._0_4_ = fVar59;
        fVar63 = auVar49._8_4_ * fVar63;
        auVar69._8_4_ = fVar63;
        fVar64 = auVar49._12_4_ * fVar64;
        auVar69._12_4_ = fVar64;
        fVar65 = auVar49._16_4_ * fVar65;
        auVar69._16_4_ = fVar65;
        fVar66 = auVar49._20_4_ * fVar66;
        auVar69._20_4_ = fVar66;
        fVar67 = auVar49._24_4_ * fVar67;
        auVar69._24_4_ = fVar67;
        auVar69._28_4_ = auVar48._28_4_;
        auVar53 = ZEXT3264(auVar69);
        auVar48._4_4_ = fVar62 * auVar47._4_4_;
        auVar48._0_4_ = fVar59 * auVar47._0_4_;
        auVar48._8_4_ = fVar63 * auVar47._8_4_;
        auVar48._12_4_ = fVar64 * auVar47._12_4_;
        auVar48._16_4_ = fVar65 * auVar47._16_4_;
        auVar48._20_4_ = fVar66 * auVar47._20_4_;
        auVar48._24_4_ = fVar67 * auVar47._24_4_;
        auVar48._28_4_ = auVar49._28_4_;
        auVar31 = vfmsub213ps_fma(auVar50,auVar48,auVar69);
        auVar31 = vfnmadd213ps_fma(ZEXT1632(auVar31),auVar47,auVar48);
        auVar47._4_4_ = fVar3 * 0.5;
        auVar47._0_4_ = fVar2 * 0.5;
        auVar47._8_4_ = fVar4 * 0.5;
        auVar47._12_4_ = fVar5 * 0.5;
        auVar47._16_4_ = fVar6 * 0.5;
        auVar47._20_4_ = fVar7 * 0.5;
        auVar47._24_4_ = fVar8 * 0.5;
        auVar47._28_4_ = auVar1._28_4_;
        auVar31 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar31),auVar47);
        *(undefined1 (*) [32])*pauVar26 = ZEXT1632(auVar31);
        pauVar26 = (undefined1 (*) [64])(*pauVar26 + 0x20);
        uVar23 = uVar21 + 0xf;
        uVar21 = uVar21 + 8;
      }
      uVar23 = uVar21 | 3;
      auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      while ((int)uVar23 < (int)uVar24) {
        auVar33 = *(undefined1 (*) [16])*pauVar26;
        auVar32._0_4_ = auVar33._0_4_ * auVar33._0_4_ * 0.044715;
        auVar32._4_4_ = auVar33._4_4_ * auVar33._4_4_ * 0.044715;
        auVar32._8_4_ = auVar33._8_4_ * auVar33._8_4_ * 0.044715;
        auVar32._12_4_ = auVar33._12_4_ * auVar33._12_4_ * 0.044715;
        auVar32 = vfmadd213ps_fma(auVar32,auVar33,auVar33);
        auVar60._0_4_ = auVar32._0_4_ * 0.7978845;
        auVar60._4_4_ = auVar32._4_4_ * 0.7978845;
        auVar60._8_4_ = auVar32._8_4_ * 0.7978845;
        auVar60._12_4_ = auVar32._12_4_ * 0.7978845;
        auVar32 = vmaxps_avx(auVar60,auVar73);
        auVar32 = vminps_avx(auVar74,auVar32);
        fVar2 = auVar32._0_4_;
        auVar68._0_4_ = fVar2 * fVar2;
        fVar59 = auVar32._4_4_;
        auVar68._4_4_ = fVar59 * fVar59;
        fVar3 = auVar32._8_4_;
        auVar68._8_4_ = fVar3 * fVar3;
        fVar62 = auVar32._12_4_;
        auVar68._12_4_ = fVar62 * fVar62;
        auVar32 = vfmadd213ps_fma(auVar75,auVar68,auVar76);
        auVar32 = vfmadd213ps_fma(auVar32,auVar68,auVar77);
        auVar32 = vfmadd213ps_fma(auVar32,auVar68,auVar78);
        auVar32 = vfmadd213ps_fma(auVar32,auVar68,auVar79);
        auVar32 = vfmadd213ps_fma(auVar32,auVar68,auVar80);
        auVar32 = vfmadd213ps_fma(auVar32,auVar68,auVar81);
        auVar61._0_4_ = auVar32._0_4_ * fVar2;
        auVar61._4_4_ = auVar32._4_4_ * fVar59;
        auVar61._8_4_ = auVar32._8_4_ * fVar3;
        auVar61._12_4_ = auVar32._12_4_ * fVar62;
        auVar32 = vfmadd213ps_avx512vl(auVar28,auVar68,auVar29);
        auVar32 = vfmadd213ps_avx512vl(auVar32,auVar68,auVar30);
        auVar60 = vfmadd213ps_fma(auVar32,auVar68,auVar81);
        auVar32 = vrcpps_avx(auVar60);
        auVar71._0_4_ = auVar61._0_4_ * auVar32._0_4_;
        auVar71._4_4_ = auVar61._4_4_ * auVar32._4_4_;
        auVar71._8_4_ = auVar61._8_4_ * auVar32._8_4_;
        auVar71._12_4_ = auVar61._12_4_ * auVar32._12_4_;
        auVar60 = vfmsub213ps_fma(auVar60,auVar71,auVar61);
        auVar32 = vfnmadd213ps_fma(auVar60,auVar32,auVar71);
        auVar33 = vmulps_avx512vl(auVar33,auVar31);
        auVar33 = vfmadd213ps_fma(auVar33,auVar32,auVar33);
        *(undefined1 (*) [16])*pauVar26 = auVar33;
        pauVar26 = (undefined1 (*) [64])(*pauVar26 + 0x10);
        uVar23 = uVar21 + 7;
        uVar21 = uVar21 + 4;
      }
      if (uVar24 - uVar21 != 0 && (int)uVar21 <= (int)uVar24) {
        lVar27 = 0;
        do {
          fVar2 = *(float *)(*pauVar26 + lVar27 * 4);
          auVar28 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 * fVar2 * 0.044715)),ZEXT416((uint)fVar2),
                                    ZEXT416((uint)fVar2));
          auVar52._0_4_ = tanhf(auVar28._0_4_ * 0.7978845);
          auVar52._4_60_ = extraout_var;
          auVar28 = vfmadd213ss_fma(auVar52._0_16_,ZEXT416((uint)(fVar2 * 0.5)),
                                    ZEXT416((uint)(fVar2 * 0.5)));
          *(int *)(*pauVar26 + lVar27 * 4) = auVar28._0_4_;
          lVar27 = lVar27 + 1;
        } while (uVar24 - uVar21 != (int)lVar27);
      }
      lVar25 = lVar25 + 1;
      auVar51 = vbroadcastss_avx512f(ZEXT416(0x3d372713));
      auVar52 = vbroadcastss_avx512f(ZEXT416(0x3f4c4229));
      auVar53 = vbroadcastss_avx512f(ZEXT416(0x3f000000));
      auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3d372713));
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f4c4229));
      auVar36 = vbroadcastss_avx512vl(ZEXT416(0xc1100000));
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x41100000));
      auVar38 = vbroadcastss_avx512vl(ZEXT416(0xa59f25c0));
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x2a61337e));
      auVar40 = vbroadcastss_avx512vl(ZEXT416(0xaebd37ff));
      auVar41 = vbroadcastss_avx512vl(ZEXT416(0x335c0041));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3779434a));
      auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3a270ded));
      auVar44 = vbroadcastss_avx512vl(ZEXT416(0x3ba059dc));
      auVar45 = vbroadcastss_avx512vl(ZEXT416(0x35a0d3d8));
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x38f895d6));
    } while (lVar25 != iVar22);
  }
  return 0;
}

Assistant:

int GELU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}